

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

CopyForm1 __thiscall
ImageTypeManager::convert(ImageTypeManager *this,uint8_t typeIn,uint8_t typeOut)

{
  iterator iVar1;
  imageException *this_00;
  key_type local_12;
  
  iVar1 = std::
          _Rb_tree<std::pair<unsigned_char,_unsigned_char>,_std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>,_std::_Select1st<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>,_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
          ::find(&(this->_intertypeConvertMap)._M_t,&local_12);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->_intertypeConvertMap)._M_t._M_impl.super__Rb_tree_header) {
    return (CopyForm1)iVar1._M_node[1]._M_parent;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this_00,"Copy function between different image types is not registered");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

Image_Function_Helper::FunctionTable::CopyForm1 ImageTypeManager::convert( uint8_t typeIn, uint8_t typeOut )
{
    std::map< std::pair<uint8_t, uint8_t>, Image_Function_Helper::FunctionTable::CopyForm1 >::const_iterator copy =
        _intertypeConvertMap.find( std::pair<uint8_t, uint8_t>( typeIn, typeOut ) );
    if ( copy == _intertypeConvertMap.cend() )
        throw imageException( "Copy function between different image types is not registered" );

    return copy->second;
}